

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O1

int archive_write_set_format_v7tar(archive *_a)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_v7tar");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)&_a[2].file_count != (code *)0x0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    puVar2 = (undefined8 *)malloc(0x28);
    if (puVar2 == (undefined8 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate v7tar data");
    }
    else {
      puVar2[2] = 0;
      puVar2[3] = 0;
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2[4] = 0;
      *(undefined8 **)&_a[1].current_codepage = puVar2;
      _a[1].sconv = (archive_string_conv *)"tar (non-POSIX)";
      _a[2].vtable = (archive_vtable_conflict *)archive_write_v7tar_options;
      _a[2].archive_format_name = (char *)archive_write_v7tar_header;
      *(code **)&_a[2].compression_code = archive_write_v7tar_data;
      _a[2].compression_name = (char *)archive_write_v7tar_close;
      *(code **)&_a[2].file_count = archive_write_v7tar_free;
      *(code **)&_a[2].archive_format = archive_write_v7tar_finish_entry;
      _a->archive_format = 0x30000;
      _a->archive_format_name = "tar (non-POSIX)";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_v7tar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct v7tar *v7tar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_v7tar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	/* Basic internal sanity test. */
	if (sizeof(template_header) != 512) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal: template_header wrong size: %zu should be 512",
		    sizeof(template_header));
		return (ARCHIVE_FATAL);
	}

	v7tar = (struct v7tar *)malloc(sizeof(*v7tar));
	if (v7tar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return (ARCHIVE_FATAL);
	}
	memset(v7tar, 0, sizeof(*v7tar));
	a->format_data = v7tar;
	a->format_name = "tar (non-POSIX)";
	a->format_options = archive_write_v7tar_options;
	a->format_write_header = archive_write_v7tar_header;
	a->format_write_data = archive_write_v7tar_data;
	a->format_close = archive_write_v7tar_close;
	a->format_free = archive_write_v7tar_free;
	a->format_finish_entry = archive_write_v7tar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR;
	a->archive.archive_format_name = "tar (non-POSIX)";
	return (ARCHIVE_OK);
}